

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

_Bool http_set_known_header(nng_http *conn,char *key,char *val)

{
  int iVar1;
  char *key_00;
  char *__s;
  nng_http_res *pnVar2;
  nni_http_header *h;
  
  iVar1 = nni_strcasecmp(key,"Content-Type");
  if (iVar1 == 0) {
    pnVar2 = &conn->res;
    if (conn->client != false) {
      pnVar2 = (nng_http_res *)&conn->req;
    }
    __s = (pnVar2->data).ctype;
    snprintf(__s,0x80,"%s",val);
    h = &(pnVar2->data).content_type;
    key_00 = "Content-Type";
  }
  else {
    iVar1 = nni_strcasecmp(key,"Content-Length");
    if (iVar1 != 0) {
      if ((conn->client != false) && (iVar1 = nni_strcasecmp(key,"Host"), iVar1 == 0)) {
        nni_http_set_host(conn,val);
        return true;
      }
      return false;
    }
    pnVar2 = &conn->res;
    if (conn->client != false) {
      pnVar2 = (nng_http_res *)&conn->req;
    }
    __s = (pnVar2->data).clen;
    snprintf(__s,0x18,"%s",val);
    h = &(pnVar2->data).content_length;
    key_00 = "Content-Length";
  }
  nni_http_set_static_header(conn,h,key_00,__s);
  return true;
}

Assistant:

static bool
http_set_known_header(nng_http *conn, const char *key, const char *val)
{
	if (nni_strcasecmp(key, "Content-Type") == 0) {
		nni_http_set_content_type(conn, val);
		return (true);
	}
	if (nni_strcasecmp(key, "Content-Length") == 0) {
		nni_http_entity *data =
		    conn->client ? &conn->req.data : &conn->res.data;
		snprintf(data->clen, sizeof(data->clen), "%s", val);
		nni_http_set_static_header(
		    conn, &data->content_length, "Content-Length", data->clen);
		return (true);
	}

	if (conn->client) {
		if (nni_strcasecmp(key, "Host") == 0) {
			nni_http_set_host(conn, val);
			return (true);
		}
	}
	return (false);
}